

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall capnp::_::ListBuilder::asReader(ListBuilder *this)

{
  ElementSize EVar1;
  StructPointerCount SVar2;
  StructDataBitCount SVar3;
  byte *pbVar4;
  CapTableReader *pCVar5;
  BitsPerElementN<23> BVar6;
  ListReader *in_RDI;
  
  pbVar4 = this->ptr;
  SVar3 = this->structDataSize;
  SVar2 = this->structPointerCount;
  EVar1 = this->elementSize;
  pCVar5 = &this->capTable->super_CapTableReader;
  in_RDI->segment = &this->segment->super_SegmentReader;
  in_RDI->capTable = pCVar5;
  in_RDI->ptr = pbVar4;
  BVar6 = this->step;
  in_RDI->elementCount = this->elementCount;
  in_RDI->step = BVar6;
  in_RDI->structDataSize = SVar3;
  in_RDI->structPointerCount = SVar2;
  in_RDI->elementSize = EVar1;
  in_RDI->nestingLimit = 0x7fffffff;
  return in_RDI;
}

Assistant:

ListReader ListBuilder::asReader() const {
  return ListReader(segment, capTable, ptr, elementCount, step, structDataSize, structPointerCount,
                    elementSize, kj::maxValue);
}